

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O3

size_t HUF_writeCTable_wksp
                 (void *dst,size_t maxDstSize,HUF_CElt *CTable,uint maxSymbolValue,uint huffLog,
                 void *workspace,size_t workspaceSize)

{
  void *buffer;
  void *dst_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  char cVar22;
  char cVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uint uVar31;
  ulong uVar32;
  size_t sVar33;
  long lVar34;
  ulong uVar35;
  char *pcVar36;
  long lVar37;
  ulong srcSize;
  undefined1 auVar38 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  int iVar58;
  int iVar61;
  int iVar62;
  undefined1 auVar59 [16];
  int iVar63;
  undefined1 auVar60 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  int iVar77;
  int iVar81;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  uint local_64;
  size_t local_60;
  char *local_58;
  uint local_4c;
  short *local_48;
  size_t local_40;
  size_t local_38;
  
  if (workspaceSize < 0x2c0) {
    return 0xffffffffffffffff;
  }
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  *(undefined1 *)((long)workspace + 0x1b4) = 0;
  auVar30 = _DAT_00271180;
  auVar29 = _DAT_00271170;
  auVar28 = _DAT_00261a10;
  auVar27 = _DAT_00261a00;
  auVar26 = _DAT_002619f0;
  auVar25 = _DAT_0025e440;
  auVar24 = _DAT_0025e430;
  uVar31 = huffLog + 1;
  if (1 < uVar31) {
    lVar34 = (ulong)uVar31 - 2;
    auVar38._8_4_ = (int)lVar34;
    auVar38._0_8_ = lVar34;
    auVar38._12_4_ = (int)((ulong)lVar34 >> 0x20);
    lVar37 = 0;
    lVar34 = 0;
    do {
      auVar56._8_4_ = (int)lVar34;
      auVar56._0_8_ = lVar34;
      auVar56._12_4_ = (int)((ulong)lVar34 >> 0x20);
      auVar59 = auVar38 ^ auVar25;
      auVar64 = (auVar56 | auVar24) ^ auVar25;
      iVar58 = auVar59._0_4_;
      iVar77 = -(uint)(iVar58 < auVar64._0_4_);
      iVar61 = auVar59._4_4_;
      auVar66._4_4_ = -(uint)(iVar61 < auVar64._4_4_);
      iVar62 = auVar59._8_4_;
      iVar81 = -(uint)(iVar62 < auVar64._8_4_);
      iVar63 = auVar59._12_4_;
      auVar66._12_4_ = -(uint)(iVar63 < auVar64._12_4_);
      auVar39._4_4_ = iVar77;
      auVar39._0_4_ = iVar77;
      auVar39._8_4_ = iVar81;
      auVar39._12_4_ = iVar81;
      auVar39 = pshuflw(in_XMM1,auVar39,0xe8);
      auVar65._4_4_ = -(uint)(auVar64._4_4_ == iVar61);
      auVar65._12_4_ = -(uint)(auVar64._12_4_ == iVar63);
      auVar65._0_4_ = auVar65._4_4_;
      auVar65._8_4_ = auVar65._12_4_;
      auVar48 = pshuflw(in_XMM2,auVar65,0xe8);
      auVar66._0_4_ = auVar66._4_4_;
      auVar66._8_4_ = auVar66._12_4_;
      auVar64 = pshuflw(auVar39,auVar66,0xe8);
      auVar59._8_4_ = 0xffffffff;
      auVar59._0_8_ = 0xffffffffffffffff;
      auVar59._12_4_ = 0xffffffff;
      auVar59 = (auVar64 | auVar48 & auVar39) ^ auVar59;
      auVar59 = packssdw(auVar59,auVar59);
      cVar22 = (char)huffLog;
      cVar23 = (char)lVar37;
      if ((auVar59 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)workspace + lVar34 + 0x1b5) = cVar22 + cVar23;
      }
      auVar48._4_4_ = iVar77;
      auVar48._0_4_ = iVar77;
      auVar48._8_4_ = iVar81;
      auVar48._12_4_ = iVar81;
      auVar66 = auVar65 & auVar48 | auVar66;
      auVar59 = packssdw(auVar66,auVar66);
      auVar64._8_4_ = 0xffffffff;
      auVar64._0_8_ = 0xffffffffffffffff;
      auVar64._12_4_ = 0xffffffff;
      auVar59 = packssdw(auVar59 ^ auVar64,auVar59 ^ auVar64);
      auVar59 = packsswb(auVar59,auVar59);
      if ((auVar59._0_4_ >> 8 & 1) != 0) {
        *(char *)((long)workspace + lVar34 + 0x1b6) = cVar22 + cVar23 + -1;
      }
      auVar59 = (auVar56 | auVar28) ^ auVar25;
      auVar49._0_4_ = -(uint)(iVar58 < auVar59._0_4_);
      auVar49._4_4_ = -(uint)(iVar61 < auVar59._4_4_);
      auVar49._8_4_ = -(uint)(iVar62 < auVar59._8_4_);
      auVar49._12_4_ = -(uint)(iVar63 < auVar59._12_4_);
      auVar67._4_4_ = auVar49._0_4_;
      auVar67._0_4_ = auVar49._0_4_;
      auVar67._8_4_ = auVar49._8_4_;
      auVar67._12_4_ = auVar49._8_4_;
      iVar77 = -(uint)(auVar59._4_4_ == iVar61);
      iVar81 = -(uint)(auVar59._12_4_ == iVar63);
      auVar10._4_4_ = iVar77;
      auVar10._0_4_ = iVar77;
      auVar10._8_4_ = iVar81;
      auVar10._12_4_ = iVar81;
      auVar78._4_4_ = auVar49._4_4_;
      auVar78._0_4_ = auVar49._4_4_;
      auVar78._8_4_ = auVar49._12_4_;
      auVar78._12_4_ = auVar49._12_4_;
      auVar59 = auVar10 & auVar67 | auVar78;
      auVar59 = packssdw(auVar59,auVar59);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar59 = packssdw(auVar59 ^ auVar1,auVar59 ^ auVar1);
      auVar59 = packsswb(auVar59,auVar59);
      if ((auVar59._0_4_ >> 0x10 & 1) != 0) {
        *(char *)((long)workspace + lVar34 + 0x1b7) = cVar22 + cVar23 + -2;
      }
      auVar59 = pshufhw(auVar59,auVar67,0x84);
      auVar11._4_4_ = iVar77;
      auVar11._0_4_ = iVar77;
      auVar11._8_4_ = iVar81;
      auVar11._12_4_ = iVar81;
      auVar64 = pshufhw(auVar49,auVar11,0x84);
      auVar39 = pshufhw(auVar59,auVar78,0x84);
      auVar40._8_4_ = 0xffffffff;
      auVar40._0_8_ = 0xffffffffffffffff;
      auVar40._12_4_ = 0xffffffff;
      auVar40 = (auVar39 | auVar64 & auVar59) ^ auVar40;
      auVar59 = packssdw(auVar40,auVar40);
      auVar59 = packsswb(auVar59,auVar59);
      if ((auVar59._0_4_ >> 0x18 & 1) != 0) {
        *(char *)((long)workspace + lVar34 + 0x1b8) = cVar22 + cVar23 + -3;
      }
      auVar59 = (auVar56 | auVar27) ^ auVar25;
      auVar50._0_4_ = -(uint)(iVar58 < auVar59._0_4_);
      auVar50._4_4_ = -(uint)(iVar61 < auVar59._4_4_);
      auVar50._8_4_ = -(uint)(iVar62 < auVar59._8_4_);
      auVar50._12_4_ = -(uint)(iVar63 < auVar59._12_4_);
      auVar12._4_4_ = auVar50._0_4_;
      auVar12._0_4_ = auVar50._0_4_;
      auVar12._8_4_ = auVar50._8_4_;
      auVar12._12_4_ = auVar50._8_4_;
      auVar64 = pshuflw(auVar78,auVar12,0xe8);
      auVar41._0_4_ = -(uint)(auVar59._0_4_ == iVar58);
      auVar41._4_4_ = -(uint)(auVar59._4_4_ == iVar61);
      auVar41._8_4_ = -(uint)(auVar59._8_4_ == iVar62);
      auVar41._12_4_ = -(uint)(auVar59._12_4_ == iVar63);
      auVar68._4_4_ = auVar41._4_4_;
      auVar68._0_4_ = auVar41._4_4_;
      auVar68._8_4_ = auVar41._12_4_;
      auVar68._12_4_ = auVar41._12_4_;
      auVar59 = pshuflw(auVar41,auVar68,0xe8);
      auVar69._4_4_ = auVar50._4_4_;
      auVar69._0_4_ = auVar50._4_4_;
      auVar69._8_4_ = auVar50._12_4_;
      auVar69._12_4_ = auVar50._12_4_;
      auVar39 = pshuflw(auVar50,auVar69,0xe8);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar59 = packssdw(auVar59 & auVar64,(auVar39 | auVar59 & auVar64) ^ auVar2);
      auVar59 = packsswb(auVar59,auVar59);
      if ((auVar59 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(char *)((long)workspace + lVar34 + 0x1b9) = cVar22 + cVar23 + -4;
      }
      auVar13._4_4_ = auVar50._0_4_;
      auVar13._0_4_ = auVar50._0_4_;
      auVar13._8_4_ = auVar50._8_4_;
      auVar13._12_4_ = auVar50._8_4_;
      auVar69 = auVar68 & auVar13 | auVar69;
      auVar39 = packssdw(auVar69,auVar69);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar59 = packssdw(auVar59,auVar39 ^ auVar3);
      auVar59 = packsswb(auVar59,auVar59);
      if ((auVar59._4_2_ >> 8 & 1) != 0) {
        *(char *)((long)workspace + lVar34 + 0x1ba) = cVar22 + cVar23 + -5;
      }
      auVar59 = (auVar56 | auVar26) ^ auVar25;
      auVar51._0_4_ = -(uint)(iVar58 < auVar59._0_4_);
      auVar51._4_4_ = -(uint)(iVar61 < auVar59._4_4_);
      auVar51._8_4_ = -(uint)(iVar62 < auVar59._8_4_);
      auVar51._12_4_ = -(uint)(iVar63 < auVar59._12_4_);
      auVar70._4_4_ = auVar51._0_4_;
      auVar70._0_4_ = auVar51._0_4_;
      auVar70._8_4_ = auVar51._8_4_;
      auVar70._12_4_ = auVar51._8_4_;
      iVar77 = -(uint)(auVar59._4_4_ == iVar61);
      iVar81 = -(uint)(auVar59._12_4_ == iVar63);
      auVar14._4_4_ = iVar77;
      auVar14._0_4_ = iVar77;
      auVar14._8_4_ = iVar81;
      auVar14._12_4_ = iVar81;
      auVar79._4_4_ = auVar51._4_4_;
      auVar79._0_4_ = auVar51._4_4_;
      auVar79._8_4_ = auVar51._12_4_;
      auVar79._12_4_ = auVar51._12_4_;
      auVar59 = auVar14 & auVar70 | auVar79;
      auVar59 = packssdw(auVar59,auVar59);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar59 = packssdw(auVar59 ^ auVar4,auVar59 ^ auVar4);
      auVar59 = packsswb(auVar59,auVar59);
      if ((auVar59 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(char *)((long)workspace + lVar34 + 0x1bb) = cVar22 + cVar23 + -6;
      }
      auVar59 = pshufhw(auVar59,auVar70,0x84);
      auVar15._4_4_ = iVar77;
      auVar15._0_4_ = iVar77;
      auVar15._8_4_ = iVar81;
      auVar15._12_4_ = iVar81;
      auVar64 = pshufhw(auVar51,auVar15,0x84);
      auVar39 = pshufhw(auVar59,auVar79,0x84);
      auVar42._8_4_ = 0xffffffff;
      auVar42._0_8_ = 0xffffffffffffffff;
      auVar42._12_4_ = 0xffffffff;
      auVar42 = (auVar39 | auVar64 & auVar59) ^ auVar42;
      auVar59 = packssdw(auVar42,auVar42);
      auVar59 = packsswb(auVar59,auVar59);
      if ((auVar59._6_2_ >> 8 & 1) != 0) {
        *(char *)((long)workspace + lVar34 + 0x1bc) = cVar22 + cVar23 + -7;
      }
      auVar59 = (auVar56 | auVar30) ^ auVar25;
      auVar52._0_4_ = -(uint)(iVar58 < auVar59._0_4_);
      auVar52._4_4_ = -(uint)(iVar61 < auVar59._4_4_);
      auVar52._8_4_ = -(uint)(iVar62 < auVar59._8_4_);
      auVar52._12_4_ = -(uint)(iVar63 < auVar59._12_4_);
      auVar16._4_4_ = auVar52._0_4_;
      auVar16._0_4_ = auVar52._0_4_;
      auVar16._8_4_ = auVar52._8_4_;
      auVar16._12_4_ = auVar52._8_4_;
      auVar64 = pshuflw(auVar79,auVar16,0xe8);
      auVar43._0_4_ = -(uint)(auVar59._0_4_ == iVar58);
      auVar43._4_4_ = -(uint)(auVar59._4_4_ == iVar61);
      auVar43._8_4_ = -(uint)(auVar59._8_4_ == iVar62);
      auVar43._12_4_ = -(uint)(auVar59._12_4_ == iVar63);
      auVar71._4_4_ = auVar43._4_4_;
      auVar71._0_4_ = auVar43._4_4_;
      auVar71._8_4_ = auVar43._12_4_;
      auVar71._12_4_ = auVar43._12_4_;
      auVar59 = pshuflw(auVar43,auVar71,0xe8);
      auVar72._4_4_ = auVar52._4_4_;
      auVar72._0_4_ = auVar52._4_4_;
      auVar72._8_4_ = auVar52._12_4_;
      auVar72._12_4_ = auVar52._12_4_;
      auVar39 = pshuflw(auVar52,auVar72,0xe8);
      auVar53._8_4_ = 0xffffffff;
      auVar53._0_8_ = 0xffffffffffffffff;
      auVar53._12_4_ = 0xffffffff;
      auVar53 = (auVar39 | auVar59 & auVar64) ^ auVar53;
      auVar39 = packssdw(auVar53,auVar53);
      auVar59 = packsswb(auVar59 & auVar64,auVar39);
      if ((auVar59 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)workspace + lVar34 + 0x1bd) = cVar22 + cVar23 + -8;
      }
      auVar17._4_4_ = auVar52._0_4_;
      auVar17._0_4_ = auVar52._0_4_;
      auVar17._8_4_ = auVar52._8_4_;
      auVar17._12_4_ = auVar52._8_4_;
      auVar72 = auVar71 & auVar17 | auVar72;
      auVar39 = packssdw(auVar72,auVar72);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar39 = packssdw(auVar39 ^ auVar5,auVar39 ^ auVar5);
      auVar59 = packsswb(auVar59,auVar39);
      if ((auVar59._8_2_ >> 8 & 1) != 0) {
        *(char *)((long)workspace + lVar34 + 0x1be) = cVar22 + cVar23 + -9;
      }
      auVar59 = (auVar56 | auVar29) ^ auVar25;
      auVar54._0_4_ = -(uint)(iVar58 < auVar59._0_4_);
      auVar54._4_4_ = -(uint)(iVar61 < auVar59._4_4_);
      auVar54._8_4_ = -(uint)(iVar62 < auVar59._8_4_);
      auVar54._12_4_ = -(uint)(iVar63 < auVar59._12_4_);
      auVar73._4_4_ = auVar54._0_4_;
      auVar73._0_4_ = auVar54._0_4_;
      auVar73._8_4_ = auVar54._8_4_;
      auVar73._12_4_ = auVar54._8_4_;
      iVar77 = -(uint)(auVar59._4_4_ == iVar61);
      iVar81 = -(uint)(auVar59._12_4_ == iVar63);
      auVar18._4_4_ = iVar77;
      auVar18._0_4_ = iVar77;
      auVar18._8_4_ = iVar81;
      auVar18._12_4_ = iVar81;
      auVar80._4_4_ = auVar54._4_4_;
      auVar80._0_4_ = auVar54._4_4_;
      auVar80._8_4_ = auVar54._12_4_;
      auVar80._12_4_ = auVar54._12_4_;
      auVar59 = auVar18 & auVar73 | auVar80;
      auVar59 = packssdw(auVar59,auVar59);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar59 = packssdw(auVar59 ^ auVar6,auVar59 ^ auVar6);
      auVar59 = packsswb(auVar59,auVar59);
      if ((auVar59 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(char *)((long)workspace + lVar34 + 0x1bf) = cVar22 + cVar23 + -10;
      }
      auVar59 = pshufhw(auVar59,auVar73,0x84);
      auVar19._4_4_ = iVar77;
      auVar19._0_4_ = iVar77;
      auVar19._8_4_ = iVar81;
      auVar19._12_4_ = iVar81;
      auVar64 = pshufhw(auVar54,auVar19,0x84);
      auVar39 = pshufhw(auVar59,auVar80,0x84);
      auVar44._8_4_ = 0xffffffff;
      auVar44._0_8_ = 0xffffffffffffffff;
      auVar44._12_4_ = 0xffffffff;
      auVar44 = (auVar39 | auVar64 & auVar59) ^ auVar44;
      auVar59 = packssdw(auVar44,auVar44);
      auVar59 = packsswb(auVar59,auVar59);
      if ((auVar59._10_2_ >> 8 & 1) != 0) {
        *(char *)((long)workspace + lVar34 + 0x1c0) = cVar22 + cVar23 + -0xb;
      }
      auVar59 = (auVar56 | _DAT_00271160) ^ auVar25;
      auVar55._0_4_ = -(uint)(iVar58 < auVar59._0_4_);
      auVar55._4_4_ = -(uint)(iVar61 < auVar59._4_4_);
      auVar55._8_4_ = -(uint)(iVar62 < auVar59._8_4_);
      auVar55._12_4_ = -(uint)(iVar63 < auVar59._12_4_);
      auVar20._4_4_ = auVar55._0_4_;
      auVar20._0_4_ = auVar55._0_4_;
      auVar20._8_4_ = auVar55._8_4_;
      auVar20._12_4_ = auVar55._8_4_;
      auVar64 = pshuflw(auVar80,auVar20,0xe8);
      auVar45._0_4_ = -(uint)(auVar59._0_4_ == iVar58);
      auVar45._4_4_ = -(uint)(auVar59._4_4_ == iVar61);
      auVar45._8_4_ = -(uint)(auVar59._8_4_ == iVar62);
      auVar45._12_4_ = -(uint)(auVar59._12_4_ == iVar63);
      auVar74._4_4_ = auVar45._4_4_;
      auVar74._0_4_ = auVar45._4_4_;
      auVar74._8_4_ = auVar45._12_4_;
      auVar74._12_4_ = auVar45._12_4_;
      auVar59 = pshuflw(auVar45,auVar74,0xe8);
      auVar75._4_4_ = auVar55._4_4_;
      auVar75._0_4_ = auVar55._4_4_;
      auVar75._8_4_ = auVar55._12_4_;
      auVar75._12_4_ = auVar55._12_4_;
      auVar39 = pshuflw(auVar55,auVar75,0xe8);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar59 = packssdw(auVar59 & auVar64,(auVar39 | auVar59 & auVar64) ^ auVar7);
      auVar59 = packsswb(auVar59,auVar59);
      if ((auVar59 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(char *)((long)workspace + lVar34 + 0x1c1) = cVar22 + cVar23 + -0xc;
      }
      auVar21._4_4_ = auVar55._0_4_;
      auVar21._0_4_ = auVar55._0_4_;
      auVar21._8_4_ = auVar55._8_4_;
      auVar21._12_4_ = auVar55._8_4_;
      auVar75 = auVar74 & auVar21 | auVar75;
      auVar39 = packssdw(auVar75,auVar75);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar59 = packssdw(auVar59,auVar39 ^ auVar8);
      auVar59 = packsswb(auVar59,auVar59);
      if ((auVar59._12_2_ >> 8 & 1) != 0) {
        *(char *)((long)workspace + lVar34 + 0x1c2) = cVar22 + cVar23 + -0xd;
      }
      auVar59 = (auVar56 | _DAT_00271150) ^ auVar25;
      auVar46._0_4_ = -(uint)(iVar58 < auVar59._0_4_);
      auVar46._4_4_ = -(uint)(iVar61 < auVar59._4_4_);
      auVar46._8_4_ = -(uint)(iVar62 < auVar59._8_4_);
      auVar46._12_4_ = -(uint)(iVar63 < auVar59._12_4_);
      auVar76._4_4_ = auVar46._0_4_;
      auVar76._0_4_ = auVar46._0_4_;
      auVar76._8_4_ = auVar46._8_4_;
      auVar76._12_4_ = auVar46._8_4_;
      auVar57._4_4_ = -(uint)(auVar59._4_4_ == iVar61);
      auVar57._12_4_ = -(uint)(auVar59._12_4_ == iVar63);
      auVar57._0_4_ = auVar57._4_4_;
      auVar57._8_4_ = auVar57._12_4_;
      auVar60._4_4_ = auVar46._4_4_;
      auVar60._0_4_ = auVar46._4_4_;
      auVar60._8_4_ = auVar46._12_4_;
      auVar60._12_4_ = auVar46._12_4_;
      auVar39 = auVar57 & auVar76 | auVar60;
      auVar59 = packssdw(auVar46,auVar39);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar59 = packssdw(auVar59 ^ auVar9,auVar59 ^ auVar9);
      auVar59 = packsswb(auVar59,auVar59);
      if ((auVar59 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(char *)((long)workspace + lVar34 + 0x1c3) = cVar22 + cVar23 + -0xe;
      }
      auVar59 = pshufhw(auVar59,auVar76,0x84);
      auVar39 = pshufhw(auVar39,auVar57,0x84);
      in_XMM2 = auVar39 & auVar59;
      auVar59 = pshufhw(auVar59,auVar60,0x84);
      auVar47._8_4_ = 0xffffffff;
      auVar47._0_8_ = 0xffffffffffffffff;
      auVar47._12_4_ = 0xffffffff;
      auVar47 = (auVar59 | in_XMM2) ^ auVar47;
      auVar59 = packssdw(auVar47,auVar47);
      in_XMM1 = packsswb(auVar59,auVar59);
      if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
        *(char *)((long)workspace + lVar34 + 0x1c4) = cVar22 + cVar23 + -0xf;
      }
      lVar34 = lVar34 + 0x10;
      lVar37 = lVar37 + -0x10;
    } while (-lVar37 != ((ulong)uVar31 + 0xe & 0xfffffffffffffff0));
  }
  local_58 = (char *)dst;
  if (maxSymbolValue == 0) {
    srcSize = 0;
  }
  else {
    srcSize = (ulong)maxSymbolValue;
    uVar32 = 0;
    do {
      *(undefined1 *)((long)workspace + uVar32 + 0x1c1) =
           *(undefined1 *)((long)workspace + (ulong)CTable[uVar32].nbBits + 0x1b4);
      uVar32 = uVar32 + 1;
    } while (srcSize != uVar32);
    buffer = (void *)((long)dst + 1);
    local_64 = 0xc;
    if (maxSymbolValue != 1) {
      local_60 = maxDstSize;
      uVar31 = HIST_count_simple((uint *)((long)workspace + 0x164),&local_64,
                                 (void *)((long)workspace + 0x1c1),srcSize);
      maxDstSize = local_60;
      if (uVar31 != 1 && uVar31 != maxSymbolValue) {
        local_4c = FSE_optimalTableLog(6,srcSize,local_64);
        local_48 = (short *)((long)workspace + 0x198);
        sVar33 = FSE_normalizeCount(local_48,local_4c,(uint *)((long)workspace + 0x164),srcSize,
                                    local_64,0);
        uVar31 = local_4c;
        if (0xffffffffffffff88 < sVar33) {
          return sVar33;
        }
        local_38 = local_60 - 1;
        local_40 = FSE_writeNCount(buffer,local_38,local_48,local_64,local_4c);
        if (0xffffffffffffff88 < local_40) {
          return local_40;
        }
        sVar33 = FSE_buildCTable_wksp
                           ((FSE_CTable *)workspace,local_48,local_64,uVar31,
                            (void *)((long)workspace + 0xec),0x78);
        if (0xffffffffffffff88 < sVar33) {
          return sVar33;
        }
        dst_00 = (void *)(local_40 + (long)buffer);
        sVar33 = FSE_compress_usingCTable
                           (dst_00,local_38 - local_40,(void *)((long)workspace + 0x1c1),srcSize,
                            (FSE_CTable *)workspace);
        if (0xffffffffffffff88 < sVar33) {
          return sVar33;
        }
        maxDstSize = local_60;
        if (sVar33 != 0) {
          uVar32 = (long)dst_00 + (sVar33 - (long)buffer);
          if (0xffffffffffffff88 < uVar32) {
            return uVar32;
          }
          local_58 = local_58;
          if (uVar32 < maxSymbolValue >> 1 && 1 < uVar32) {
            *local_58 = (char)uVar32;
            return uVar32 + 1;
          }
        }
      }
    }
  }
  pcVar36 = (char *)((long)dst + 1);
  uVar32 = 0xffffffffffffffff;
  if (maxSymbolValue < 0x81) {
    uVar35 = (ulong)((maxSymbolValue + 1 >> 1) + 1);
    uVar32 = 0xffffffffffffffba;
    if (uVar35 <= maxDstSize) {
      *local_58 = (char)maxSymbolValue + '\x7f';
      *(undefined1 *)((long)workspace + srcSize + 0x1c1) = 0;
      uVar32 = uVar35;
      if (maxSymbolValue != 0) {
        uVar35 = 0;
        do {
          *pcVar36 = *(char *)((long)workspace + uVar35 + 0x1c1) * '\x10' +
                     *(char *)((long)workspace + uVar35 + 0x1c2);
          uVar35 = uVar35 + 2;
          pcVar36 = pcVar36 + 1;
        } while (uVar35 < srcSize);
      }
    }
  }
  return uVar32;
}

Assistant:

size_t HUF_writeCTable_wksp(void* dst, size_t maxDstSize,
                            const HUF_CElt* CTable, unsigned maxSymbolValue, unsigned huffLog,
                            void* workspace, size_t workspaceSize)
{
    BYTE* op = (BYTE*)dst;
    U32 n;
    HUF_WriteCTableWksp* wksp = (HUF_WriteCTableWksp*)workspace;

    /* check conditions */
    if (workspaceSize < sizeof(HUF_WriteCTableWksp)) return ERROR(GENERIC);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);

    /* convert to weight */
    wksp->bitsToWeight[0] = 0;
    for (n=1; n<huffLog+1; n++)
        wksp->bitsToWeight[n] = (BYTE)(huffLog + 1 - n);
    for (n=0; n<maxSymbolValue; n++)
        wksp->huffWeight[n] = wksp->bitsToWeight[CTable[n].nbBits];

    /* attempt weights compression by FSE */
    {   CHECK_V_F(hSize, HUF_compressWeights(op+1, maxDstSize-1, wksp->huffWeight, maxSymbolValue, &wksp->wksp, sizeof(wksp->wksp)) );
        if ((hSize>1) & (hSize < maxSymbolValue/2)) {   /* FSE compressed */
            op[0] = (BYTE)hSize;
            return hSize+1;
    }   }

    /* write raw values as 4-bits (max : 15) */
    if (maxSymbolValue > (256-128)) return ERROR(GENERIC);   /* should not happen : likely means source cannot be compressed */
    if (((maxSymbolValue+1)/2) + 1 > maxDstSize) return ERROR(dstSize_tooSmall);   /* not enough space within dst buffer */
    op[0] = (BYTE)(128 /*special case*/ + (maxSymbolValue-1));
    wksp->huffWeight[maxSymbolValue] = 0;   /* to be sure it doesn't cause msan issue in final combination */
    for (n=0; n<maxSymbolValue; n+=2)
        op[(n/2)+1] = (BYTE)((wksp->huffWeight[n] << 4) + wksp->huffWeight[n+1]);
    return ((maxSymbolValue+1)/2) + 1;
}